

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dayperiodrules.cpp
# Opt level: O0

void __thiscall
icu_63::DayPeriodRulesCountSink::put
          (DayPeriodRulesCountSink *this,char *key,ResourceValue *value,UBool param_3,
          UErrorCode *errorCode)

{
  UBool UVar1;
  int32_t iVar2;
  int32_t local_5c;
  int32_t setNum;
  int32_t i;
  ResourceTable rules;
  UErrorCode *errorCode_local;
  UBool param_3_local;
  ResourceValue *value_local;
  char *key_local;
  DayPeriodRulesCountSink *this_local;
  
  rules._32_8_ = errorCode;
  value_local = (ResourceValue *)key;
  key_local = (char *)this;
  (*(value->super_UObject)._vptr_UObject[0xb])(&setNum,value,errorCode);
  UVar1 = ::U_FAILURE(*(UErrorCode *)rules._32_8_);
  if (UVar1 == '\0') {
    local_5c = 0;
    while (UVar1 = ResourceTable::getKeyAndValue
                             ((ResourceTable *)&setNum,local_5c,(char **)&value_local,value),
          UVar1 != '\0') {
      iVar2 = DayPeriodRulesDataSink::parseSetNum((char *)value_local,(UErrorCode *)rules._32_8_);
      if (*(int *)((anonymous_namespace)::data + 0x10) < iVar2) {
        *(int32_t *)((anonymous_namespace)::data + 0x10) = iVar2;
      }
      local_5c = local_5c + 1;
    }
  }
  return;
}

Assistant:

virtual void put(const char *key, ResourceValue &value, UBool, UErrorCode &errorCode) {
        ResourceTable rules = value.getTable(errorCode);
        if (U_FAILURE(errorCode)) { return; }

        for (int32_t i = 0; rules.getKeyAndValue(i, key, value); ++i) {
            int32_t setNum = DayPeriodRulesDataSink::parseSetNum(key, errorCode);
            if (setNum > data->maxRuleSetNum) {
                data->maxRuleSetNum = setNum;
            }
        }
    }